

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O2

bool __thiscall
spvtools::SpirvTools::Validate
          (SpirvTools *this,uint32_t *binary,size_t binary_size,spv_validator_options options)

{
  Impl IVar1;
  spv_result_t sVar2;
  spv_diagnostic diagnostic;
  spv_const_binary_t the_binary;
  
  diagnostic = (spv_diagnostic)0x0;
  the_binary.code = binary;
  the_binary.wordCount = binary_size;
  sVar2 = spvValidateWithOptions
                    (((this->impl_)._M_t.
                      super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                      .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl)->
                     context,options,&the_binary,&diagnostic);
  if ((sVar2 != SPV_SUCCESS) &&
     (IVar1.context =
           ((this->impl_)._M_t.
            super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
            .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl)->context,
     *(_Manager_type *)((long)&(IVar1.context)->consumer + 0x10) != (_Manager_type)0x0)) {
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&(IVar1.context)->consumer,SPV_MSG_ERROR,(char *)0x0,&diagnostic->position,
               diagnostic->error);
  }
  spvDiagnosticDestroy(diagnostic);
  return sVar2 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Validate(const uint32_t* binary, const size_t binary_size,
                          spv_validator_options options) const {
  spv_const_binary_t the_binary{binary, binary_size};
  spv_diagnostic diagnostic = nullptr;
  bool valid = spvValidateWithOptions(impl_->context, options, &the_binary,
                                      &diagnostic) == SPV_SUCCESS;
  if (!valid && impl_->context->consumer) {
    impl_->context->consumer.operator()(
        SPV_MSG_ERROR, nullptr, diagnostic->position, diagnostic->error);
  }
  spvDiagnosticDestroy(diagnostic);
  return valid;
}